

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings.cpp
# Opt level: O3

ReadStatus __thiscall
PartiallyDownloadedBlock::InitData
          (PartiallyDownloadedBlock *this,CBlockHeaderAndShortTxIDs *cmpctblock,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *extra_txn)

{
  ushort uVar1;
  pointer puVar2;
  long *plVar3;
  _Hash_node_base *p_Var4;
  _Hash_node_base *p_Var5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  element_type *peVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uint uVar12;
  bool bVar13;
  ulong uVar14;
  pointer puVar15;
  mapped_type *pmVar16;
  size_type sVar17;
  uint64_t uVar18;
  pointer psVar19;
  Logger *this_00;
  __hash_code __code;
  pointer pPVar20;
  long lVar21;
  pointer psVar22;
  ReadStatus RVar23;
  shared_ptr<const_CTransaction> *tx;
  CBlockHeader *pCVar24;
  pointer pPVar25;
  CBlockHeader *pCVar26;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *p_Var27;
  uint uVar28;
  ulong uVar29;
  long in_FS_OFFSET;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  string_view source_file;
  string_view logging_function;
  unsigned_long local_e8;
  unordered_map<unsigned_long,_unsigned_short,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>_>
  shorttxids;
  vector<bool,_std::allocator<bool>_> local_a0;
  uint256 local_78;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  undefined8 local_48;
  undefined8 local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  RVar23 = READ_STATUS_INVALID;
  if ((cmpctblock->header).nBits != 0) {
    puVar15 = (cmpctblock->shorttxids).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar2 = (cmpctblock->shorttxids).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar15 == puVar2) {
      pPVar25 = (cmpctblock->prefilledtxn).
                super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pPVar20 = (cmpctblock->prefilledtxn).
                super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (pPVar25 == pPVar20) goto LAB_0085e2ec;
    }
    else {
      pPVar25 = (cmpctblock->prefilledtxn).
                super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pPVar20 = (cmpctblock->prefilledtxn).
                super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
    if ((((ulong)(((long)pPVar20 - (long)pPVar25 >> 3) * -0x5555555555555555 +
                 ((long)puVar2 - (long)puVar15 >> 3)) < 0x186a1) && ((this->header).nBits == 0)) &&
       ((this->txn_available).
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->txn_available).
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      pCVar24 = &cmpctblock->header;
      pCVar26 = &this->header;
      for (lVar21 = 10; lVar21 != 0; lVar21 = lVar21 + -1) {
        uVar8 = (pCVar24->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0];
        uVar9 = (pCVar24->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[1];
        uVar10 = (pCVar24->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[2];
        uVar11 = (pCVar24->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[3];
        pCVar26->nVersion = pCVar24->nVersion;
        (pCVar26->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0] = uVar8;
        (pCVar26->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[1] = uVar9;
        (pCVar26->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[2] = uVar10;
        (pCVar26->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[3] = uVar11;
        pCVar24 = (CBlockHeader *)
                  ((pCVar24->hashPrevBlock).super_base_blob<256U>.m_data._M_elems + 4);
        pCVar26 = (CBlockHeader *)
                  ((pCVar26->hashPrevBlock).super_base_blob<256U>.m_data._M_elems + 4);
      }
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::resize(&this->txn_available,
               ((long)(cmpctblock->prefilledtxn).
                      super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(cmpctblock->prefilledtxn).
                      super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
               ((long)(cmpctblock->shorttxids).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(cmpctblock->shorttxids).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3));
      pPVar25 = (cmpctblock->prefilledtxn).
                super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((cmpctblock->prefilledtxn).
          super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
          super__Vector_impl_data._M_finish == pPVar25) {
        uVar14 = 0;
      }
      else {
        uVar28 = 0xffffffff;
        lVar21 = 0x10;
        uVar29 = 0;
        do {
          plVar3 = *(long **)((long)pPVar25 + lVar21 + -8);
          if (((*plVar3 == plVar3[1]) && (plVar3[3] == plVar3[4])) ||
             ((uVar28 = uVar28 + *(ushort *)((long)pPVar25 + lVar21 + -0x10) + 1,
              0xffff < (int)uVar28 ||
              (((long)(cmpctblock->shorttxids).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(cmpctblock->shorttxids).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) + uVar29 < (ulong)uVar28))))
          goto LAB_0085e2ec;
          psVar19 = (this->txn_available).
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar28;
          (psVar19->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
               (element_type *)plVar3;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(psVar19->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount,
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&pPVar25->index + lVar21))
          ;
          uVar29 = uVar29 + 1;
          pPVar25 = (cmpctblock->prefilledtxn).
                    super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar14 = ((long)(cmpctblock->prefilledtxn).
                          super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar25 >> 3) *
                   -0x5555555555555555;
          lVar21 = lVar21 + 0x18;
        } while (uVar29 < uVar14);
      }
      this->prefilled_count = uVar14;
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_short>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_Hashtable(&shorttxids._M_h,
                   (long)(cmpctblock->shorttxids).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(cmpctblock->shorttxids).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3,(hash<unsigned_long> *)&local_a0,
                   (key_equal *)&criticalblock7,(allocator_type *)&local_78);
      puVar15 = (cmpctblock->shorttxids).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((cmpctblock->shorttxids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
          ._M_impl.super__Vector_impl_data._M_finish == puVar15) {
        uVar14 = 0;
      }
      else {
        uVar29 = 0;
        uVar28 = 0;
        do {
          uVar12 = uVar28;
          do {
            uVar28 = uVar12;
            lVar21 = (uVar28 & 0xffff) + uVar29;
            uVar12 = uVar28 + 1;
          } while ((this->txn_available).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar21].
                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                   (element_type *)0x0);
          pmVar16 = std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_short>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_short>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&shorttxids._M_h,puVar15 + uVar29);
          *pmVar16 = (mapped_type)lVar21;
          sVar17 = std::
                   _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_short>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::bucket_size(&shorttxids._M_h,
                                 (cmpctblock->shorttxids).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar29] %
                                 shorttxids._M_h._M_bucket_count);
          if (0xc < sVar17) {
            RVar23 = READ_STATUS_FAILED;
            goto LAB_0085e2e2;
          }
          uVar29 = uVar29 + 1;
          puVar15 = (cmpctblock->shorttxids).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar14 = (long)(cmpctblock->shorttxids).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar15 >> 3;
        } while (uVar29 < uVar14);
      }
      RVar23 = READ_STATUS_FAILED;
      if (shorttxids._M_h._M_element_count == uVar14) {
        criticalblock7.super_unique_lock._M_device =
             (mutex_type *)((ulong)criticalblock7.super_unique_lock._M_device & 0xffffffffffffff00);
        std::vector<bool,_std::allocator<bool>_>::vector
                  (&local_a0,
                   (long)(this->txn_available).
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->txn_available).
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4,(bool *)&criticalblock7,
                   (allocator_type *)&local_78);
        criticalblock7.super_unique_lock._M_device = &(this->pool->cs).super_recursive_mutex;
        criticalblock7.super_unique_lock._M_owns = false;
        std::unique_lock<std::recursive_mutex>::lock(&criticalblock7.super_unique_lock);
        psVar22 = (this->pool->txns_randomized).
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (psVar19 = (this->pool->txns_randomized).
                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; psVar19 != psVar22;
            psVar19 = psVar19 + 1) {
          uVar18 = SipHashUint256(cmpctblock->shorttxidk0,cmpctblock->shorttxidk1,
                                  &(((psVar19->
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->m_witness_hash).m_wrapped);
          uVar14 = (ulong)(uVar18 & 0xffffffffffff) % shorttxids._M_h._M_bucket_count;
          if (shorttxids._M_h._M_buckets[uVar14] != (__node_base_ptr)0x0) {
            p_Var4 = shorttxids._M_h._M_buckets[uVar14]->_M_nxt;
            p_Var5 = p_Var4[1]._M_nxt;
            while ((_Hash_node_base *)(uVar18 & 0xffffffffffff) != p_Var5) {
              p_Var4 = p_Var4->_M_nxt;
              if ((p_Var4 == (_Hash_node_base *)0x0) ||
                 (p_Var5 = p_Var4[1]._M_nxt,
                 (ulong)p_Var5 % shorttxids._M_h._M_bucket_count != uVar14)) goto LAB_0085e029;
            }
            uVar1 = *(ushort *)&p_Var4[2]._M_nxt;
            p_Var27 = &(this->txn_available).
                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar1].
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
            if ((local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar1 >> 6] >>
                 ((ulong)uVar1 & 0x3f) & 1) == 0) {
              p_Var27->_M_ptr =
                   (psVar19->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        (&p_Var27->_M_refcount,
                         &(psVar19->
                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                          _M_refcount);
              lVar21 = 1;
              local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[*(ushort *)&p_Var4[2]._M_nxt >> 6] =
                   local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [*(ushort *)&p_Var4[2]._M_nxt >> 6] |
                   1L << ((byte)*(ushort *)&p_Var4[2]._M_nxt & 0x3f);
            }
            else {
              if (p_Var27->_M_ptr == (element_type *)0x0) goto LAB_0085e029;
              _Var6._M_pi = (p_Var27->_M_refcount)._M_pi;
              p_Var27->_M_ptr = (element_type *)0x0;
              p_Var27->_M_refcount = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              lVar21 = -1;
              if (_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
              }
            }
            this->mempool_count = this->mempool_count + lVar21;
          }
LAB_0085e029:
          if (this->mempool_count == shorttxids._M_h._M_element_count) break;
        }
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock7.super_unique_lock);
        psVar19 = (extra_txn->
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        psVar22 = (extra_txn->
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        if (psVar22 != psVar19) {
          uVar14 = 0;
          do {
            peVar7 = psVar19[uVar14].
                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if (peVar7 != (element_type *)0x0) {
              uVar18 = SipHashUint256(cmpctblock->shorttxidk0,cmpctblock->shorttxidk1,
                                      &(peVar7->m_witness_hash).m_wrapped);
              uVar29 = (ulong)(uVar18 & 0xffffffffffff) % shorttxids._M_h._M_bucket_count;
              if (shorttxids._M_h._M_buckets[uVar29] != (__node_base_ptr)0x0) {
                p_Var4 = shorttxids._M_h._M_buckets[uVar29]->_M_nxt;
                p_Var5 = p_Var4[1]._M_nxt;
                while ((_Hash_node_base *)(uVar18 & 0xffffffffffff) != p_Var5) {
                  p_Var4 = p_Var4->_M_nxt;
                  if ((p_Var4 == (_Hash_node_base *)0x0) ||
                     (p_Var5 = p_Var4[1]._M_nxt,
                     (ulong)p_Var5 % shorttxids._M_h._M_bucket_count != uVar29)) goto LAB_0085e1d1;
                }
                uVar1 = *(ushort *)&p_Var4[2]._M_nxt;
                if ((local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar1 >> 6] >>
                     ((ulong)uVar1 & 0x3f) & 1) == 0) {
                  psVar19 = (extra_txn->
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar14;
                  psVar22 = (this->txn_available).
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar1;
                  (psVar22->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr = (psVar19->
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr;
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                            (&(psVar22->
                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                              _M_refcount,
                             &(psVar19->
                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                              _M_refcount);
                  lVar21 = 1;
                  local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                  [*(ushort *)&p_Var4[2]._M_nxt >> 6] =
                       local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [*(ushort *)&p_Var4[2]._M_nxt >> 6] |
                       1L << ((byte)*(ushort *)&p_Var4[2]._M_nxt & 0x3f);
LAB_0085e1b7:
                  auVar31._8_4_ = (int)lVar21;
                  auVar31._0_8_ = lVar21;
                  auVar31._12_4_ = (int)((ulong)lVar21 >> 0x20);
                  this->mempool_count = lVar21 + this->mempool_count;
                  this->extra_count = auVar31._8_8_ + this->extra_count;
                }
                else {
                  psVar19 = (this->txn_available).
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  lVar21 = (long)psVar19[uVar1].
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr;
                  if (lVar21 != 0) {
                    peVar7 = (extra_txn->
                             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[uVar14].
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
                    auVar32[0] = -(*(char *)&(peVar7->m_witness_hash).m_wrapped ==
                                  *(char *)(lVar21 + 0x59));
                    auVar32[1] = -(*(uchar *)((long)&peVar7->m_witness_hash + 1) ==
                                  *(uchar *)(lVar21 + 0x5a));
                    auVar32[2] = -(*(uchar *)((long)&peVar7->m_witness_hash + 2) ==
                                  *(uchar *)(lVar21 + 0x5b));
                    auVar32[3] = -(*(uchar *)((long)&peVar7->m_witness_hash + 3) ==
                                  *(uchar *)(lVar21 + 0x5c));
                    auVar32[4] = -(*(uchar *)((long)&peVar7->m_witness_hash + 4) ==
                                  *(uchar *)(lVar21 + 0x5d));
                    auVar32[5] = -(*(uchar *)((long)&peVar7->m_witness_hash + 5) ==
                                  *(uchar *)(lVar21 + 0x5e));
                    auVar32[6] = -(*(uchar *)((long)&peVar7->m_witness_hash + 6) ==
                                  *(uchar *)(lVar21 + 0x5f));
                    auVar32[7] = -(*(uchar *)((long)&peVar7->m_witness_hash + 7) ==
                                  *(uchar *)(lVar21 + 0x60));
                    auVar32[8] = -(*(uchar *)((long)&peVar7->m_witness_hash + 8) ==
                                  *(uchar *)(lVar21 + 0x61));
                    auVar32[9] = -(*(uchar *)((long)&peVar7->m_witness_hash + 9) ==
                                  *(uchar *)(lVar21 + 0x62));
                    auVar32[10] = -(*(uchar *)((long)&peVar7->m_witness_hash + 10) ==
                                   *(uchar *)(lVar21 + 99));
                    auVar32[0xb] = -(*(uchar *)((long)&peVar7->m_witness_hash + 0xb) ==
                                    *(uchar *)(lVar21 + 100));
                    auVar32[0xc] = -(*(uchar *)((long)&peVar7->m_witness_hash + 0xc) ==
                                    *(uchar *)(lVar21 + 0x65));
                    auVar32[0xd] = -(*(uchar *)((long)&peVar7->m_witness_hash + 0xd) ==
                                    *(uchar *)(lVar21 + 0x66));
                    auVar32[0xe] = -(*(uchar *)((long)&peVar7->m_witness_hash + 0xe) ==
                                    *(uchar *)(lVar21 + 0x67));
                    auVar32[0xf] = -(*(uchar *)((long)&peVar7->m_witness_hash + 0xf) ==
                                    *(uchar *)(lVar21 + 0x68));
                    auVar30[0] = -(*(uchar *)((long)&peVar7->m_witness_hash + 0x10) ==
                                  *(uchar *)(lVar21 + 0x69));
                    auVar30[1] = -(*(uchar *)((long)&peVar7->m_witness_hash + 0x11) ==
                                  *(uchar *)(lVar21 + 0x6a));
                    auVar30[2] = -(*(uchar *)((long)&peVar7->m_witness_hash + 0x12) ==
                                  *(uchar *)(lVar21 + 0x6b));
                    auVar30[3] = -(*(uchar *)((long)&peVar7->m_witness_hash + 0x13) ==
                                  *(uchar *)(lVar21 + 0x6c));
                    auVar30[4] = -(*(uchar *)((long)&peVar7->m_witness_hash + 0x14) ==
                                  *(uchar *)(lVar21 + 0x6d));
                    auVar30[5] = -(*(uchar *)((long)&peVar7->m_witness_hash + 0x15) ==
                                  *(uchar *)(lVar21 + 0x6e));
                    auVar30[6] = -(*(uchar *)((long)&peVar7->m_witness_hash + 0x16) ==
                                  *(uchar *)(lVar21 + 0x6f));
                    auVar30[7] = -(*(uchar *)((long)&peVar7->m_witness_hash + 0x17) ==
                                  *(uchar *)(lVar21 + 0x70));
                    auVar30[8] = -(*(uchar *)((long)&peVar7->m_witness_hash + 0x18) ==
                                  *(uchar *)(lVar21 + 0x71));
                    auVar30[9] = -(*(uchar *)((long)&peVar7->m_witness_hash + 0x19) ==
                                  *(uchar *)(lVar21 + 0x72));
                    auVar30[10] = -(*(uchar *)((long)&peVar7->m_witness_hash + 0x1a) ==
                                   *(uchar *)(lVar21 + 0x73));
                    auVar30[0xb] = -(*(uchar *)((long)&peVar7->m_witness_hash + 0x1b) ==
                                    *(uchar *)(lVar21 + 0x74));
                    auVar30[0xc] = -(*(uchar *)((long)&peVar7->m_witness_hash + 0x1c) ==
                                    *(uchar *)(lVar21 + 0x75));
                    auVar30[0xd] = -(*(uchar *)((long)&peVar7->m_witness_hash + 0x1d) ==
                                    *(uchar *)(lVar21 + 0x76));
                    auVar30[0xe] = -(*(uchar *)((long)&peVar7->m_witness_hash + 0x1e) ==
                                    *(uchar *)(lVar21 + 0x77));
                    auVar30[0xf] = -(*(uchar *)((long)&peVar7->m_witness_hash + 0x1f) ==
                                    *(uchar *)(lVar21 + 0x78));
                    auVar30 = auVar30 & auVar32;
                    if ((ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe |
                                (ushort)(byte)(auVar30[0xf] >> 7) << 0xf) != 0xffff) {
                      p_Var27 = &psVar19[uVar1].
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
                      _Var6._M_pi = (p_Var27->_M_refcount)._M_pi;
                      p_Var27->_M_ptr = (element_type *)0x0;
                      p_Var27->_M_refcount = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      lVar21 = -1;
                      if (_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
                      }
                      goto LAB_0085e1b7;
                    }
                  }
                }
              }
LAB_0085e1d1:
              if (this->mempool_count == shorttxids._M_h._M_element_count) break;
              psVar19 = (extra_txn->
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              psVar22 = (extra_txn->
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 < (ulong)((long)psVar22 - (long)psVar19 >> 4));
        }
        this_00 = LogInstance();
        bVar13 = BCLog::Logger::WillLogCategoryLevel(this_00,CMPCTBLOCK,Debug);
        if (bVar13) {
          CBlockHeader::GetHash(&local_78,&cmpctblock->header);
          base_blob<256u>::ToString_abi_cxx11_((string *)&criticalblock7,&local_78);
          CBlockHeaderAndShortTxIDs::
          SerializationOps<SizeComputer,CBlockHeaderAndShortTxIDs_const,ActionSerialize>(cmpctblock)
          ;
          local_e8 = 0;
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/blockencodings.cpp"
          ;
          source_file._M_len = 0x62;
          logging_function._M_str = "InitData";
          logging_function._M_len = 8;
          LogPrintFormatInternal<std::__cxx11::string,unsigned_long>
                    (logging_function,source_file,0xaa,CMPCTBLOCK,Debug,
                     (ConstevalFormatString<2U>)0xf6db28,(string *)&criticalblock7,&local_e8);
          if (criticalblock7.super_unique_lock._M_device != (mutex_type *)&stack0xffffffffffffffb8)
          {
            operator_delete(criticalblock7.super_unique_lock._M_device,local_48 + 1);
          }
        }
        if (local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
          operator_delete(local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                          (long)local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage -
                          (long)local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        }
        RVar23 = READ_STATUS_OK;
      }
LAB_0085e2e2:
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_short>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&shorttxids._M_h);
    }
  }
LAB_0085e2ec:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return RVar23;
  }
  __stack_chk_fail();
}

Assistant:

ReadStatus PartiallyDownloadedBlock::InitData(const CBlockHeaderAndShortTxIDs& cmpctblock, const std::vector<CTransactionRef>& extra_txn) {
    if (cmpctblock.header.IsNull() || (cmpctblock.shorttxids.empty() && cmpctblock.prefilledtxn.empty()))
        return READ_STATUS_INVALID;
    if (cmpctblock.shorttxids.size() + cmpctblock.prefilledtxn.size() > MAX_BLOCK_WEIGHT / MIN_SERIALIZABLE_TRANSACTION_WEIGHT)
        return READ_STATUS_INVALID;

    if (!header.IsNull() || !txn_available.empty()) return READ_STATUS_INVALID;

    header = cmpctblock.header;
    txn_available.resize(cmpctblock.BlockTxCount());

    int32_t lastprefilledindex = -1;
    for (size_t i = 0; i < cmpctblock.prefilledtxn.size(); i++) {
        if (cmpctblock.prefilledtxn[i].tx->IsNull())
            return READ_STATUS_INVALID;

        lastprefilledindex += cmpctblock.prefilledtxn[i].index + 1; //index is a uint16_t, so can't overflow here
        if (lastprefilledindex > std::numeric_limits<uint16_t>::max())
            return READ_STATUS_INVALID;
        if ((uint32_t)lastprefilledindex > cmpctblock.shorttxids.size() + i) {
            // If we are inserting a tx at an index greater than our full list of shorttxids
            // plus the number of prefilled txn we've inserted, then we have txn for which we
            // have neither a prefilled txn or a shorttxid!
            return READ_STATUS_INVALID;
        }
        txn_available[lastprefilledindex] = cmpctblock.prefilledtxn[i].tx;
    }
    prefilled_count = cmpctblock.prefilledtxn.size();

    // Calculate map of txids -> positions and check mempool to see what we have (or don't)
    // Because well-formed cmpctblock messages will have a (relatively) uniform distribution
    // of short IDs, any highly-uneven distribution of elements can be safely treated as a
    // READ_STATUS_FAILED.
    std::unordered_map<uint64_t, uint16_t> shorttxids(cmpctblock.shorttxids.size());
    uint16_t index_offset = 0;
    for (size_t i = 0; i < cmpctblock.shorttxids.size(); i++) {
        while (txn_available[i + index_offset])
            index_offset++;
        shorttxids[cmpctblock.shorttxids[i]] = i + index_offset;
        // To determine the chance that the number of entries in a bucket exceeds N,
        // we use the fact that the number of elements in a single bucket is
        // binomially distributed (with n = the number of shorttxids S, and p =
        // 1 / the number of buckets), that in the worst case the number of buckets is
        // equal to S (due to std::unordered_map having a default load factor of 1.0),
        // and that the chance for any bucket to exceed N elements is at most
        // buckets * (the chance that any given bucket is above N elements).
        // Thus: P(max_elements_per_bucket > N) <= S * (1 - cdf(binomial(n=S,p=1/S), N)).
        // If we assume blocks of up to 16000, allowing 12 elements per bucket should
        // only fail once per ~1 million block transfers (per peer and connection).
        if (shorttxids.bucket_size(shorttxids.bucket(cmpctblock.shorttxids[i])) > 12)
            return READ_STATUS_FAILED;
    }
    // TODO: in the shortid-collision case, we should instead request both transactions
    // which collided. Falling back to full-block-request here is overkill.
    if (shorttxids.size() != cmpctblock.shorttxids.size())
        return READ_STATUS_FAILED; // Short ID collision

    std::vector<bool> have_txn(txn_available.size());
    {
    LOCK(pool->cs);
    for (const auto& tx : pool->txns_randomized) {
        uint64_t shortid = cmpctblock.GetShortID(tx->GetWitnessHash());
        std::unordered_map<uint64_t, uint16_t>::iterator idit = shorttxids.find(shortid);
        if (idit != shorttxids.end()) {
            if (!have_txn[idit->second]) {
                txn_available[idit->second] = tx;
                have_txn[idit->second]  = true;
                mempool_count++;
            } else {
                // If we find two mempool txn that match the short id, just request it.
                // This should be rare enough that the extra bandwidth doesn't matter,
                // but eating a round-trip due to FillBlock failure would be annoying
                if (txn_available[idit->second]) {
                    txn_available[idit->second].reset();
                    mempool_count--;
                }
            }
        }
        // Though ideally we'd continue scanning for the two-txn-match-shortid case,
        // the performance win of an early exit here is too good to pass up and worth
        // the extra risk.
        if (mempool_count == shorttxids.size())
            break;
    }
    }

    for (size_t i = 0; i < extra_txn.size(); i++) {
        if (extra_txn[i] == nullptr) {
            continue;
        }
        uint64_t shortid = cmpctblock.GetShortID(extra_txn[i]->GetWitnessHash());
        std::unordered_map<uint64_t, uint16_t>::iterator idit = shorttxids.find(shortid);
        if (idit != shorttxids.end()) {
            if (!have_txn[idit->second]) {
                txn_available[idit->second] = extra_txn[i];
                have_txn[idit->second]  = true;
                mempool_count++;
                extra_count++;
            } else {
                // If we find two mempool/extra txn that match the short id, just
                // request it.
                // This should be rare enough that the extra bandwidth doesn't matter,
                // but eating a round-trip due to FillBlock failure would be annoying
                // Note that we don't want duplication between extra_txn and mempool to
                // trigger this case, so we compare witness hashes first
                if (txn_available[idit->second] &&
                        txn_available[idit->second]->GetWitnessHash() != extra_txn[i]->GetWitnessHash()) {
                    txn_available[idit->second].reset();
                    mempool_count--;
                    extra_count--;
                }
            }
        }
        // Though ideally we'd continue scanning for the two-txn-match-shortid case,
        // the performance win of an early exit here is too good to pass up and worth
        // the extra risk.
        if (mempool_count == shorttxids.size())
            break;
    }

    LogDebug(BCLog::CMPCTBLOCK, "Initialized PartiallyDownloadedBlock for block %s using a cmpctblock of size %lu\n", cmpctblock.header.GetHash().ToString(), GetSerializeSize(cmpctblock));

    return READ_STATUS_OK;
}